

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOPSOAidFunction.cpp
# Opt level: O0

char * catStrStr(char *c1,char *c2)

{
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  ulong uVar3;
  char *str3;
  int len2;
  int len1;
  char *c2_local;
  char *c1_local;
  
  sVar1 = strlen(c1);
  sVar2 = strlen(c2);
  uVar3 = (ulong)((int)sVar1 + (int)sVar2 + 10);
  if ((long)uVar3 < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  __dest = (char *)operator_new__(uVar3);
  strcpy(__dest,c1);
  strcat(__dest,c2);
  return __dest;
}

Assistant:

char *catStrStr(const char *c1, const char *c2){
    int len1 = strlen(c1), len2 = strlen(c2);
    char *str3;
    str3 = new char [len1+len2+10];
    strcpy(str3, c1);
    strcat(str3,c2);
    return str3;
}